

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O0

void test_2d_dynamic<5ul,1ul,1ul,1ul,30ul,30ul>(void)

{
  dimensions<18446744073709551615UL,_18446744073709551615UL> pad;
  dimensions<18446744073709551615UL,_18446744073709551615UL> pad_00;
  int *piVar1;
  int *piVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  value_type vVar10;
  bool bVar11;
  int local_350 [4];
  dynamic_dims_array local_340;
  dynamic_dims_array local_330;
  int local_320 [2];
  dynamic_dims_array local_318;
  int local_308 [2];
  dynamic_dims_array local_300;
  int *local_2f0;
  int *local_2e8;
  size_type local_2e0;
  dynamic_dims_array local_2d8;
  unsigned_long local_2c8;
  value_type true_idx_2;
  int local_2ac;
  undefined1 auStack_2a8 [4];
  int i_2;
  int local_294;
  int local_290;
  int j_2;
  int *local_288;
  int *local_280;
  size_type local_278;
  unsigned_long local_270;
  value_type true_idx_1;
  dimensions<18446744073709551615UL,_18446744073709551615UL> s;
  dimensions<18446744073709551615UL,_18446744073709551615UL> p;
  int i_1;
  int j_1;
  dynamic_dims_array local_238;
  int local_228 [2];
  dynamic_dims_array local_220;
  int *local_210;
  int *local_208;
  size_type local_200;
  dynamic_dims_array local_1f8;
  unsigned_long local_1e8;
  value_type true_idx;
  int local_1cc;
  undefined1 auStack_1c8 [4];
  int i;
  int local_1b4;
  int *piStack_1b0;
  int j;
  int *dptr;
  allocator<int> local_195;
  value_type_conflict1 local_194;
  dynamic_dims_array local_190;
  dynamic_dims_array local_180;
  undefined1 local_170 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_150;
  unsigned_long local_148;
  size_type local_140;
  unsigned_long local_138;
  size_type local_130;
  unsigned_long local_128;
  size_type local_120;
  bool local_112;
  bool local_111;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_110;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_100;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_f0;
  undefined1 local_e0 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  sub_l;
  size_type local_a8;
  unsigned_long local_a0;
  size_type local_98;
  int local_8c;
  size_type local_88;
  int local_7c;
  size_type local_78;
  bool local_6a;
  bool local_69;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_68;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_58;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_48;
  undefined1 local_38 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_48,0x1e,0x1e);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<int,_int,_nullptr>(&local_58,1,1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_68,1,1);
  pad.dynamic_dims_._M_elems[1] = local_68.dynamic_dims_._M_elems[1];
  pad.dynamic_dims_._M_elems[0] = local_68.dynamic_dims_._M_elems[0];
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              *)local_38,local_48,local_58,pad);
  local_69 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::is_regular();
  local_6a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_69,&local_6a);
  local_78 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                       *)local_38,0);
  local_7c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_78,&local_7c);
  local_88 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                       *)local_38,1);
  local_8c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_88,&local_8c);
  local_98 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38);
  local_a0 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_98,&local_a0);
  local_a8 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                     *)local_38);
  sub_l.pad_.dynamic_dims_._M_elems[1] = 0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_a8,sub_l.pad_.dynamic_dims_._M_elems + 1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_f0,6,0x1e);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_100,5,1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_110,1,1);
  pad_00.dynamic_dims_._M_elems[1] = local_110.dynamic_dims_._M_elems[1];
  pad_00.dynamic_dims_._M_elems[0] = local_110.dynamic_dims_._M_elems[0];
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              *)local_e0,local_f0,local_100,pad_00);
  local_111 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::is_regular();
  local_112 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_111,&local_112);
  local_120 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                        *)local_e0,0);
  local_128 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_120,&local_128);
  local_130 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                        *)local_e0,1);
  local_138 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_130,&local_138);
  local_140 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                        ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0);
  local_148 = 0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_140,&local_148);
  local_150 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      *)local_e0);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,&local_150,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,0);
  local_180._M_elems =
       (_Type)std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         *)local_38);
  vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_180,0
                         );
  vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1);
  local_190._M_elems =
       (_Type)std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         *)local_38);
  vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_190,1
                         );
  local_194 = 0x2a;
  std::allocator<int>::allocator(&local_195);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,(vVar3 + vVar4) * (vVar5 + vVar6),
             &local_194,&local_195);
  std::allocator<int>::~allocator(&local_195);
  piStack_1b0 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)local_170);
  local_1b4 = 0;
  while( true ) {
    uVar7 = (ulong)local_1b4;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1
                           );
    _auStack_1c8 = (_Type)std::experimental::
                          layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                          ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                     *)local_38);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_1c8,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_1cc = 0;
    while( true ) {
      uVar7 = (ulong)local_1cc;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      _true_idx = (_Type)std::experimental::
                         layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                    *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      if (vVar3 + vVar4 <= uVar7) break;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,1);
      local_1f8._M_elems =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                  ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                             *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_1f8,1);
      local_1e8 = (vVar3 + vVar4) * (long)local_1cc + (long)local_1b4;
      local_200 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_1cc,local_1b4);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_200,&local_1e8);
      piVar1 = piStack_1b0;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_38,local_1cc,local_1b4);
      local_208 = piVar1 + sVar8;
      local_210 = piStack_1b0 + local_1e8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_208,&local_210);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      bVar11 = false;
      if (vVar3 <= (ulong)(long)local_1cc) {
        uVar7 = (ulong)local_1cc;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,0);
        local_220._M_elems =
             (_Type)std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                    ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                               *)local_38);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_220,0);
        bVar11 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_1b0;
      if (bVar11) {
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_38,local_1cc,local_1b4);
        piVar2 = piStack_1b0;
        piVar1[sVar8] = 0x11;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_38,local_1cc,local_1b4);
        local_228[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xda,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar2 + sVar8,local_228 + 1);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_38,local_1cc,local_1b4);
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
        local_228[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0xdd,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,pvVar9,local_228);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,1);
        bVar11 = false;
        if (vVar3 <= (ulong)(long)local_1b4) {
          uVar7 = (ulong)local_1b4;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_38,1);
          local_238._M_elems =
               (_Type)std::experimental::
                      layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                 *)local_38);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_238,1);
          bVar11 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_1b0;
        if (bVar11) {
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_1cc,local_1b4);
          piVar2 = piStack_1b0;
          piVar1[sVar8] = 0x18;
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_1cc,local_1b4);
          j_1 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,0xe5,
                     "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,piVar2 + sVar8,&j_1);
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_1cc,local_1b4);
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
          i_1 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,0xe8,
                     "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,pvVar9,&i_1);
        }
      }
      local_1cc = local_1cc + 1;
    }
    local_1b4 = local_1b4 + 1;
  }
  for (p.dynamic_dims_._M_elems[1]._4_4_ = 0;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0
                              ,1), (ulong)(long)p.dynamic_dims_._M_elems[1]._4_4_ < vVar3;
      p.dynamic_dims_._M_elems[1]._4_4_ = p.dynamic_dims_._M_elems[1]._4_4_ + 1) {
    for (p.dynamic_dims_._M_elems[1]._0_4_ = 0;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_e0,0), (ulong)(long)(int)p.dynamic_dims_._M_elems[1] < vVar3;
        p.dynamic_dims_._M_elems[1]._0_4_ = (int)p.dynamic_dims_._M_elems[1] + 1) {
      join_0x00000010_0x00000000_ =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                  ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                             *)local_38);
      _true_idx_1 = (_Type)std::experimental::
                           layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                           ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                       *)local_e0);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0
                              ,1);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx_1,1);
      vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              (s.dynamic_dims_._M_elems + 1),1);
      vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx_1,0);
      vVar10 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
               operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                               &true_idx_1,1);
      local_270 = (vVar3 * vVar4 + vVar5) * vVar6 * (long)(int)p.dynamic_dims_._M_elems[1] +
                  vVar10 * (long)p.dynamic_dims_._M_elems[1]._4_4_;
      local_278 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_e0,(int)p.dynamic_dims_._M_elems[1],
                                   p.dynamic_dims_._M_elems[1]._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_278,&local_270);
      piVar1 = piStack_1b0;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_e0,(int)p.dynamic_dims_._M_elems[1],
                               p.dynamic_dims_._M_elems[1]._4_4_);
      local_280 = piVar1 + sVar8;
      local_288 = piStack_1b0 + local_270;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_280,&local_288);
      piVar1 = piStack_1b0;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_e0,(int)p.dynamic_dims_._M_elems[1],
                               p.dynamic_dims_._M_elems[1]._4_4_);
      piVar2 = piStack_1b0;
      piVar1[sVar8] = 0x47;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_e0,(int)p.dynamic_dims_._M_elems[1],
                               p.dynamic_dims_._M_elems[1]._4_4_);
      j_2 = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,piVar2 + sVar8,&j_2);
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_e0,(int)p.dynamic_dims_._M_elems[1],
                               p.dynamic_dims_._M_elems[1]._4_4_);
      pvVar9 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
      local_290 = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,pvVar9,&local_290);
    }
  }
  local_294 = 0;
  while( true ) {
    uVar7 = (ulong)local_294;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38,1
                           );
    _auStack_2a8 = (_Type)std::experimental::
                          layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                          ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                     *)local_38);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_2a8,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_2ac = 0;
    while( true ) {
      uVar7 = (ulong)local_2ac;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      _true_idx_2 = (_Type)std::experimental::
                           layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                           ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                      *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx_2,0);
      if (vVar3 + vVar4 <= uVar7) break;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,1);
      local_2d8._M_elems =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                  ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                             *)local_38);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_2d8,1);
      local_2c8 = (vVar3 + vVar4) * (long)local_2ac + (long)local_294;
      local_2e0 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_2ac,local_294);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_2e0,&local_2c8);
      piVar1 = piStack_1b0;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                *)local_38,local_2ac,local_294);
      local_2e8 = piVar1 + sVar8;
      local_2f0 = piStack_1b0 + local_2c8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_2e8,&local_2f0);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_38
                              ,0);
      bVar11 = false;
      if (vVar3 <= (ulong)(long)local_2ac) {
        uVar7 = (ulong)local_2ac;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,0);
        local_300._M_elems =
             (_Type)std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                    ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                               *)local_38);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_300,0);
        bVar11 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_1b0;
      if (bVar11) {
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_38,local_2ac,local_294);
        local_308[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x10d,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1 + sVar8,local_308 + 1);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_38,local_2ac,local_294);
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
        local_308[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x110,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,pvVar9,local_308);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_38,1);
        bVar11 = false;
        if (vVar3 <= (ulong)(long)local_294) {
          uVar7 = (ulong)local_294;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_38,1);
          local_318._M_elems =
               (_Type)std::experimental::
                      layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                 *)local_38);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_318,1);
          bVar11 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_1b0;
        if (bVar11) {
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_2ac,local_294);
          local_320[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,0x116,
                     "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,piVar1 + sVar8,local_320 + 1);
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_38,local_2ac,local_294);
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
          local_320[0] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,0x119,
                     "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,pvVar9,local_320);
        }
        else {
          uVar7 = (ulong)local_2ac;
          local_330._M_elems =
               (_Type)std::experimental::
                      layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                  *)local_e0);
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_330,0);
          bVar11 = false;
          if (uVar7 % vVar3 == 0) {
            uVar7 = (ulong)local_294;
            local_340._M_elems =
                 (_Type)std::experimental::
                        layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                        ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                    *)local_e0);
            vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                    operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                    &local_340,1);
            bVar11 = uVar7 % vVar3 == 0;
          }
          piVar1 = piStack_1b0;
          if (bVar11) {
            sVar8 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                      *)local_38,local_2ac,local_294);
            local_350[3] = 0x47;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","71",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,0x124,
                       "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,piVar1 + sVar8,local_350 + 3);
            sVar8 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                      *)local_38,local_2ac,local_294);
            pvVar9 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
            local_350[2] = 0x47;
            boost::detail::test_eq_impl<int,int>
                      ("(data.at(l.index(i, j)))","71",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,0x127,
                       "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,pvVar9,local_350 + 2);
          }
          else {
            sVar8 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                      *)local_38,local_2ac,local_294);
            local_350[1] = 0x2a;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","42",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,300,
                       "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,piVar1 + sVar8,local_350 + 1);
            sVar8 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                      *)local_38,local_2ac,local_294);
            pvVar9 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)local_170,sVar8);
            local_350[0] = 0x2a;
            boost::detail::test_eq_impl<int,int>
                      ("(data.at(l.index(i, j)))","42",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,0x12f,
                       "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,pvVar9,local_350);
          }
        }
      }
      local_2ac = local_2ac + 1;
    }
    local_294 = local_294 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}